

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_s2polygon_layer.cc
# Opt level: O2

void __thiscall
s2builderutil::S2PolygonLayer::AppendS2Loops
          (S2PolygonLayer *this,Graph *g,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *edge_loops,
          vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
          *loops)

{
  int *piVar1;
  vector<int,_std::allocator<int>_> *__range2;
  pointer pvVar2;
  int *piVar3;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> vertices;
  S2Debug local_69;
  _Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_> local_68;
  vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>
  *local_50;
  S2PolygonLayer *local_48;
  pointer local_40;
  absl local_38 [8];
  
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = (edge_loops->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_50 = (vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>
              *)loops;
  local_48 = this;
  for (pvVar2 = (edge_loops->
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pvVar2 != local_40; pvVar2 = pvVar2 + 1)
  {
    std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::reserve
              ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)&local_68,
               (long)(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 2);
    piVar1 = (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_finish;
    for (piVar3 = (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start; piVar3 != piVar1; piVar3 = piVar3 + 1) {
      std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::push_back
                ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)&local_68,
                 (g->vertices_->
                 super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)._M_impl.
                 super__Vector_impl_data._M_start +
                 (g->edges_->
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                 _M_impl.super__Vector_impl_data._M_start[*piVar3].first);
    }
    local_69 = S2Polygon::s2debug_override(local_48->polygon_);
    absl::make_unique<S2Loop,std::vector<Vector3<double>,std::allocator<Vector3<double>>>&,S2Debug>
              (local_38,(vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)&local_68,
               &local_69);
    std::
    vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>
    ::emplace_back<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>
              (local_50,(unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *)local_38);
    std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>::~unique_ptr
              ((unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *)local_38);
    if (local_68._M_impl.super__Vector_impl_data._M_finish !=
        local_68._M_impl.super__Vector_impl_data._M_start) {
      local_68._M_impl.super__Vector_impl_data._M_finish =
           local_68._M_impl.super__Vector_impl_data._M_start;
    }
  }
  std::_Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>::~_Vector_base(&local_68);
  return;
}

Assistant:

void S2PolygonLayer::AppendS2Loops(const Graph& g,
                                   const vector<Graph::EdgeLoop>& edge_loops,
                                   vector<unique_ptr<S2Loop>>* loops) const {
  vector<S2Point> vertices;
  for (const auto& edge_loop : edge_loops) {
    vertices.reserve(edge_loop.size());
    for (auto edge_id : edge_loop) {
      vertices.push_back(g.vertex(g.edge(edge_id).first));
    }
    loops->push_back(
        make_unique<S2Loop>(vertices, polygon_->s2debug_override()));
    vertices.clear();
  }
}